

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

Abc_Ntk_t *
Abc_FlowRetime_MinReg
          (Abc_Ntk_t *pNtk,int fVerbose,int fComputeInitState,int fGuaranteeInitState,
          int fBlockConst,int fForwardOnly,int fBackwardOnly,int nMaxIters,int maxDelay,
          int fFastButConservative)

{
  Abc_NtkType_t AVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  Abc_Ntk_t *pAVar5;
  void *pvVar6;
  void *__ptr;
  long lVar7;
  size_t __size;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  MinRegMan_t *pMVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  Abc_Obj_t *pAVar15;
  Vec_Int_t *pVVar16;
  int *piVar17;
  Flow_Data_t *__s;
  Abc_Ntk_t *pNtk_00;
  uint uVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  
  pMVar12 = (MinRegMan_t *)malloc(0xb0);
  pManMR = pMVar12;
  pMVar12->pNtk = pNtk;
  pMVar12->fVerbose = fVerbose;
  pMVar12->fGuaranteeInitState = fGuaranteeInitState;
  pMVar12->fBlockConst = fBlockConst;
  pMVar12->fForwardOnly = fForwardOnly;
  pMVar12->fBackwardOnly = fBackwardOnly;
  pMVar12->nMaxIters = nMaxIters;
  pMVar12->maxDelay = maxDelay;
  pMVar12->fComputeInitState = fComputeInitState;
  pMVar12->fConservTimingOnly = fFastButConservative;
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nCap = 100;
  pVVar13->nSize = 0;
  ppvVar14 = (void **)malloc(800);
  pVVar13->pArray = ppvVar14;
  pMVar12->vNodes = pVVar13;
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  pVVar13->nCap = 8;
  pVVar13->nSize = 0;
  ppvVar14 = (void **)malloc(0x40);
  pVVar13->pArray = ppvVar14;
  pMVar12->vInitConstraints = pVVar13;
  pMVar12->pInitNtk = (Abc_Ntk_t *)0x0;
  pMVar12->pInitToOrig = (NodeLag_t *)0x0;
  pMVar12->sizeInitToOrig = 0;
  if (fVerbose != 0) {
    puts("Flow-based minimum-register retiming...");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    puts("\tERROR: Can not retime with black/white boxes");
    return pNtk;
  }
  if (maxDelay != 0) {
    if (pManMR->fVerbose != 0) {
      printf("\tmax delay constraint = %d\n");
    }
    uVar8 = Abc_NtkLevel(pNtk);
    if (maxDelay < (int)uVar8) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n",
             (ulong)(uint)maxDelay,(ulong)uVar8);
      return pNtk;
    }
  }
  if (pManMR->fVerbose != 0) {
    printf("\tnetlist type = ");
  }
  AVar1 = pNtk->ntkType;
  iVar10 = pManMR->fVerbose;
  if (AVar1 == ABC_NTK_STRASH) {
    if (iVar10 != 0) {
      pcVar21 = "strash/";
      goto LAB_004798d9;
    }
  }
  else if (AVar1 == ABC_NTK_LOGIC) {
    if (iVar10 != 0) {
      pcVar21 = "logic/";
      goto LAB_004798d9;
    }
  }
  else if (AVar1 == ABC_NTK_NETLIST) {
    if (iVar10 != 0) {
      pcVar21 = "netlist/";
LAB_004798d9:
      printf(pcVar21);
    }
  }
  else if (iVar10 != 0) {
    pcVar21 = "***unknown***/";
    goto LAB_004798d9;
  }
  iVar10 = pManMR->fVerbose;
  switch(pNtk->ntkFunc) {
  case ABC_FUNC_SOP:
    if (iVar10 != 0) {
      pcVar21 = "sop";
LAB_00479943:
      puts(pcVar21);
    }
    break;
  case ABC_FUNC_BDD:
    if (iVar10 != 0) {
      pcVar21 = "bdd";
      goto LAB_00479943;
    }
    break;
  case ABC_FUNC_AIG:
    if (iVar10 != 0) {
      pcVar21 = "aig";
      goto LAB_00479943;
    }
    break;
  case ABC_FUNC_MAP:
    if (iVar10 != 0) {
      pcVar21 = "mapped";
      goto LAB_00479943;
    }
    break;
  default:
    if (iVar10 != 0) {
      pcVar21 = "***unknown***";
      goto LAB_00479943;
    }
  }
  if ((pManMR->fVerbose != 0) && (printf("\tinitial reg count = %d\n"), pManMR->fVerbose != 0)) {
    Abc_NtkLevel(pNtk);
    printf("\tinitial levels = %d\n");
    if ((pManMR->fVerbose != 0) && (Abc_FlowRetime_PrintInitStateInfo(pNtk), pManMR->fVerbose != 0))
    {
      puts("\tpushing bubbles out of latch boxes");
    }
  }
  pVVar13 = pNtk->vBoxes;
  if (0 < pVVar13->nSize) {
    lVar22 = 0;
    do {
      plVar2 = (long *)pVVar13->pArray[lVar22];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        lVar20 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        pAVar3 = *(Abc_Obj_t **)(lVar20 + (long)*(int *)plVar2[4] * 8);
        if (((ulong)pAVar3 & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pBi)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x17b,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
        }
        uVar4 = *(ulong *)(lVar20 + (long)*(int *)plVar2[6] * 8);
        if ((uVar4 & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pBo)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x17c,"void Abc_FlowRetime_RemoveLatchBubbles(Abc_Obj_t *)");
        }
        pAVar5 = pManMR->pNtk;
        uVar8 = 0;
        if (((*(byte *)(uVar4 + 0x15) & 4) != 0) && (uVar8 = 0, 0 < *(int *)(uVar4 + 0x2c))) {
          uVar8 = 0x400;
          if (plVar2[7] == 1) {
            lVar20 = 2;
          }
          else {
            if (plVar2[7] != 2) goto LAB_00479a67;
            lVar20 = 1;
          }
          plVar2[7] = lVar20;
        }
LAB_00479a67:
        uVar8 = *(uint *)((long)plVar2 + 0x14) & 0x400 ^ uVar8;
        uVar19 = *(uint *)&pAVar3->field_0x14 & 0x400;
        uVar18 = *(uint *)&pAVar3->field_0x14 & 0xfffffbff;
        *(uint *)&pAVar3->field_0x14 = uVar19 ^ uVar8 | uVar18;
        if ((pAVar5->ntkType != ABC_NTK_STRASH) && (uVar19 != uVar8)) {
          *(uint *)&pAVar3->field_0x14 = uVar18;
          pAVar15 = Abc_NtkCreateNodeInv
                              (pAVar5,(Abc_Obj_t *)
                                      pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
          Abc_ObjPatchFanin(pAVar3,(Abc_Obj_t *)
                                   pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],pAVar15);
        }
        *(byte *)(uVar4 + 0x15) = *(byte *)(uVar4 + 0x15) & 0xfb;
        *(byte *)((long)plVar2 + 0x15) = *(byte *)((long)plVar2 + 0x15) & 0xfb;
        pVVar13 = pNtk->vBoxes;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar13->nSize);
  }
  if (pManMR->fVerbose != 0) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk);
    pVVar13 = pNtk->vBoxes;
  }
  if (0 < pVVar13->nSize) {
    lVar22 = 0;
    do {
      plVar2 = (long *)pVVar13->pArray[lVar22];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        if (*(int *)((long)plVar2 + 0x1c) != 1) {
          __assert_fail("Abc_ObjFaninNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8c,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (*(int *)((long)plVar2 + 0x2c) != 1) {
          __assert_fail("Abc_ObjFanoutNum(pObj) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8d,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if ((*(uint *)((long)plVar2 + 0x14) >> 10 & 1) != 0) {
          __assert_fail("!Abc_ObjFaninC0(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x8e,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        lVar20 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        pAVar3 = *(Abc_Obj_t **)(lVar20 + (long)*(int *)plVar2[4] * 8);
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 4) {
          __assert_fail("Abc_ObjIsBi(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x91,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar10 = (pAVar3->vFanins).nSize;
        if (1 < iVar10) {
          __assert_fail("Abc_ObjFaninNum(pNext) <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x92,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (iVar10 == 0) {
          pAVar5 = pAVar3->pNtk;
          if (pAVar5->ntkType == ABC_NTK_STRASH) {
            pAVar15 = Abc_AigConst1(pAVar5);
          }
          else {
            pAVar15 = Abc_NtkCreateNodeConst0(pAVar5);
          }
          Abc_ObjAddFanin(pAVar3,pAVar15);
          lVar20 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
        }
        lVar20 = *(long *)(lVar20 + (long)*(int *)plVar2[6] * 8);
        uVar8 = *(uint *)(lVar20 + 0x14);
        if ((uVar8 & 0xf) != 5) {
          __assert_fail("Abc_ObjIsBo(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x97,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if (*(int *)(lVar20 + 0x1c) != 1) {
          __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x98,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        if ((uVar8 >> 10 & 1) != 0) {
          __assert_fail("!Abc_ObjFaninC0(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x99,
                        "Abc_Ntk_t *Abc_FlowRetime_MinReg(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int)"
                       );
        }
        pVVar13 = pNtk->vBoxes;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar13->nSize);
  }
  pMVar12 = pManMR;
  pManMR->nLatches = pNtk->nObjCounts[8];
  iVar10 = pNtk->vObjs->nSize;
  pMVar12->nNodes = iVar10 + 1;
  lVar22 = (long)iVar10 * 2 + 0xc;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  iVar11 = (int)lVar22;
  iVar9 = 0x10;
  if (0xe < iVar10 * 2 + 0xbU) {
    iVar9 = iVar11;
  }
  pVVar16->nCap = iVar9;
  if (iVar9 == 0) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar16->pArray = piVar17;
  pVVar16->nSize = iVar11;
  memset(piVar17,0,lVar22 * 4);
  pMVar12->vSinkDistHist = pVVar16;
  if (maxDelay != 0) {
    Abc_FlowRetime_InitTiming(pNtk);
    pMVar12 = pManMR;
  }
  iVar10 = pMVar12->nNodes;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar9 = iVar10;
  }
  pVVar16->nCap = iVar9;
  if (iVar9 == 0) {
    piVar17 = (int *)0x0;
  }
  else {
    piVar17 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar16->pArray = piVar17;
  pVVar16->nSize = iVar10;
  memset(piVar17,0,(long)iVar10 << 2);
  pMVar12->vLags = pVVar16;
  memset(piVar17,0,(long)pMVar12->nNodes << 2);
  __size = (long)pMVar12->nNodes * 0x18;
  __s = (Flow_Data_t *)malloc(__size);
  pMVar12->pDataArray = __s;
  memset(__s,0,__size);
  pAVar5 = pMVar12->pNtk;
  pMVar12->fIsForward = 1;
  pMVar12->iteration = 0;
  if (pMVar12->fBackwardOnly == 0) {
    iVar10 = 0;
    do {
      if (iVar10 == pMVar12->nMaxIters) break;
      pMVar12->subIteration = 0;
      if (pMVar12->fVerbose != 0) {
        printf("\tforward iteration %d\n");
      }
      iVar9 = pAVar5->nObjCounts[8];
      Abc_FlowRetime_MarkBlocks(pAVar5);
      if (pManMR->maxDelay == 0) {
        Abc_FlowRetime_PushFlows(pAVar5,1);
      }
      else {
        Abc_FlowRetime_ConstrainConserv(pAVar5);
        while (iVar10 = Abc_FlowRetime_RefineConstraints(), iVar10 != 0) {
          pManMR->subIteration = pManMR->subIteration + 1;
          Abc_FlowRetime_ClearFlows(0);
        }
      }
      iVar11 = Abc_FlowRetime_ImplementCut(pAVar5);
      memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
      pMVar12 = pManMR;
      iVar10 = pManMR->iteration + 1;
      pManMR->iteration = iVar10;
    } while (iVar11 != iVar9);
  }
  pNtk_00 = pAVar5;
  if (pAVar5->ntkType == ABC_NTK_STRASH) {
    Abc_NtkReassignIds(pAVar5);
    pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pAVar5,1);
    pMVar12 = pManMR;
    pManMR->pNtk = pNtk_00;
  }
  if ((pMVar12->fComputeInitState != 0) && (pMVar12->fVerbose != 0)) {
    Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
    pMVar12 = pManMR;
  }
  pMVar12->fIsForward = 0;
  if (pMVar12->fForwardOnly == 0) {
    do {
      pMVar12->iteration = 0;
      if (pMVar12->fGuaranteeInitState != 0) {
        if (pNtk_00 != pAVar5) {
          Abc_NtkDelete(pNtk_00);
        }
        pNtk_00 = Abc_NtkAlloc(pAVar5->ntkType,pAVar5->ntkFunc,1);
        pcVar21 = Extra_UtilStrsav(pAVar5->pName);
        pNtk_00->pName = pcVar21;
        pcVar21 = Extra_UtilStrsav(pAVar5->pSpec);
        pNtk_00->pSpec = pcVar21;
        pVVar13 = pAVar5->vObjs;
        if (0 < pVVar13->nSize) {
          lVar22 = 0;
          do {
            pAVar3 = (Abc_Obj_t *)pVVar13->pArray[lVar22];
            if (pAVar3 != (Abc_Obj_t *)0x0) {
              if (pAVar5->ntkType == ABC_NTK_STRASH) {
                if (**(int **)((ulong)pAVar3 & 0xfffffffffffffffe) != 3) {
                  __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                                ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
                }
                if ((*(uint *)((long)((ulong)pAVar3 & 0xfffffffffffffffe) + 0x14) & 0xf) != 1)
                goto LAB_0047a132;
                pAVar15 = Abc_AigConst1(pNtk_00);
              }
              else {
LAB_0047a132:
                pAVar15 = Abc_NtkDupObj(pNtk_00,pAVar3,0);
              }
              pManMR->pDataArray[(uint)pAVar3->Id].field_1.pred = pAVar15;
              *(undefined2 *)(pManMR->pDataArray + (uint)pAVar3->Id) = 0;
              uVar18 = *(uint *)&pAVar3->field_0x14 & 0x400;
              uVar8 = *(uint *)&pAVar15->field_0x14;
              *(uint *)&pAVar15->field_0x14 = uVar8 & 0xfffffbff | uVar18;
              uVar19 = *(uint *)&pAVar3->field_0x14 & 0x800;
              *(uint *)&pAVar15->field_0x14 = uVar8 & 0xfffff3ff | uVar18 | uVar19;
              *(uint *)&pAVar15->field_0x14 =
                   uVar8 & 0xfffff37f | uVar18 | uVar19 | *(uint *)&pAVar3->field_0x14 & 0x80;
              pVVar13 = pAVar5->vObjs;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < pVVar13->nSize);
          if (0 < pVVar13->nSize) {
            lVar22 = 0;
            do {
              plVar2 = (long *)pVVar13->pArray[lVar22];
              if (plVar2 != (long *)0x0) {
                pAVar3 = pManMR->pDataArray[*(uint *)(plVar2 + 2)].field_1.pred;
                if (pAVar3 == (Abc_Obj_t *)0x0) {
                  __assert_fail("pObjCopy",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                ,0x47a,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                }
                if (0 < *(int *)((long)plVar2 + 0x1c)) {
                  lVar20 = 0;
                  do {
                    lVar7 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                     (long)*(int *)(plVar2[4] + lVar20 * 4) * 8);
                    pAVar15 = pManMR->pDataArray[*(uint *)(lVar7 + 0x10)].field_1.pred;
                    if (pAVar15 == (Abc_Obj_t *)0x0) {
                      __assert_fail("pNextCopy",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                    ,0x47d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                    }
                    if (((*(uint *)&pAVar15->field_0x14 ^ *(uint *)(lVar7 + 0x14)) & 0xf) != 0) {
                      __assert_fail("pNext->Type == pNextCopy->Type",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                    ,0x47e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                    }
                    Abc_ObjAddFanin(pAVar3,pAVar15);
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < *(int *)((long)plVar2 + 0x1c));
                  pVVar13 = pAVar5->vObjs;
                }
              }
              lVar22 = lVar22 + 1;
              iVar10 = pVVar13->nSize;
            } while (lVar22 < iVar10);
            if (0 < iVar10) {
              lVar22 = 0;
              do {
                pvVar6 = pVVar13->pArray[lVar22];
                if (pvVar6 != (void *)0x0) {
                  pAVar3 = pManMR->pDataArray[*(uint *)((long)pvVar6 + 0x10)].field_1.pred;
                  if (*(int *)((long)pvVar6 + 0x2c) != (pAVar3->vFanouts).nSize) {
                    __assert_fail("Abc_ObjFanoutNum( pObj ) == Abc_ObjFanoutNum( pObjCopy )",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                  ,0x487,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                  }
                  if (*(int *)((long)pvVar6 + 0x1c) != (pAVar3->vFanins).nSize) {
                    __assert_fail("Abc_ObjFaninNum( pObj ) == Abc_ObjFaninNum( pObjCopy )",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                                  ,0x488,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
                  }
                }
                lVar22 = lVar22 + 1;
              } while (iVar10 != lVar22);
            }
          }
        }
        pMVar12 = pManMR;
        if (pAVar5->nObjs != pNtk_00->nObjs) {
          __assert_fail("Abc_NtkObjNum( pNtk ) == Abc_NtkObjNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48c,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar5->nObjCounts[8] != pNtk_00->nObjCounts[8]) {
          __assert_fail("Abc_NtkLatchNum( pNtk ) == Abc_NtkLatchNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48d,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar5->vPos->nSize != pNtk_00->vPos->nSize) {
          __assert_fail("Abc_NtkPoNum( pNtk ) == Abc_NtkPoNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48e,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        if (pAVar5->vPis->nSize != pNtk_00->vPis->nSize) {
          __assert_fail("Abc_NtkPiNum( pNtk ) == Abc_NtkPiNum( pNtkCopy )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x48f,"Abc_Ntk_t *Abc_FlowRetime_NtkDup(Abc_Ntk_t *)");
        }
        pManMR->pNtk = pNtk_00;
        if (pMVar12->fVerbose != 0) {
          printf("\trestoring network. regs = %d\n");
          pMVar12 = pManMR;
        }
      }
      if (pMVar12->fComputeInitState != 0) {
        Abc_FlowRetime_SetupBackwardInit(pNtk_00);
        pMVar12 = pManMR;
      }
      iVar10 = pMVar12->iteration;
      do {
        if (iVar10 == pMVar12->nMaxIters) break;
        pMVar12->subIteration = 0;
        if (pMVar12->fVerbose != 0) {
          printf("\tbackward iteration %d\n");
        }
        iVar9 = pNtk_00->nObjCounts[8];
        Abc_FlowRetime_AddInitBias();
        Abc_FlowRetime_MarkBlocks(pNtk_00);
        if (pManMR->maxDelay == 0) {
          Abc_FlowRetime_PushFlows(pNtk_00,1);
        }
        else {
          Abc_FlowRetime_ConstrainConserv(pNtk_00);
          while (iVar10 = Abc_FlowRetime_RefineConstraints(), iVar10 != 0) {
            pManMR->subIteration = pManMR->subIteration + 1;
            Abc_FlowRetime_ClearFlows(0);
          }
        }
        Abc_FlowRetime_RemoveInitBias();
        iVar11 = Abc_FlowRetime_ImplementCut(pNtk_00);
        memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
        pMVar12 = pManMR;
        iVar10 = pManMR->iteration + 1;
        pManMR->iteration = iVar10;
      } while (iVar11 != iVar9);
      if (pMVar12->fComputeInitState == 0) break;
      iVar10 = Abc_FlowRetime_SolveBackwardInit(pNtk_00);
      if (iVar10 != 0) {
        if (pManMR->fVerbose != 0) {
          Abc_FlowRetime_PrintInitStateInfo(pNtk_00);
        }
        break;
      }
      if (pManMR->fGuaranteeInitState == 0) goto LAB_0047a4a1;
      Abc_FlowRetime_ConstrainInit();
      Abc_NtkDelete(pManMR->pInitNtk);
      pMVar12 = pManMR;
      pManMR->pInitNtk = (Abc_Ntk_t *)0x0;
    } while( true );
  }
LAB_00479e60:
  if (pManMR->fComputeInitState != 0) {
    Abc_NtkDelete(pManMR->pInitNtk);
  }
  pVVar13 = pNtk_00->vObjs;
  if (0 < pVVar13->nSize) {
    lVar22 = 0;
    do {
      if (((fComputeInitState == 0) && (pvVar6 = pVVar13->pArray[lVar22], pvVar6 != (void *)0x0)) &&
         ((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 8)) {
        *(undefined8 *)((long)pvVar6 + 0x38) = 3;
        pVVar13 = pNtk_00->vObjs;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar13->nSize);
  }
  pMVar12 = pManMR;
  if (pManMR->pDataArray != (Flow_Data_t *)0x0) {
    free(pManMR->pDataArray);
    pMVar12 = pManMR;
    pManMR->pDataArray = (Flow_Data_t *)0x0;
  }
  if (pMVar12->pInitToOrig != (NodeLag_t *)0x0) {
    free(pMVar12->pInitToOrig);
    pMVar12 = pManMR;
    pManMR->pInitToOrig = (NodeLag_t *)0x0;
  }
  pVVar13 = pMVar12->vNodes;
  if (pVVar13 != (Vec_Ptr_t *)0x0) {
    if (pVVar13->pArray != (void **)0x0) {
      free(pVVar13->pArray);
    }
    free(pVVar13);
    pMVar12 = pManMR;
  }
  pVVar16 = pMVar12->vLags;
  if (pVVar16 != (Vec_Int_t *)0x0) {
    if (pVVar16->pArray != (int *)0x0) {
      free(pVVar16->pArray);
    }
    free(pVVar16);
    pMVar12 = pManMR;
  }
  pVVar16 = pMVar12->vSinkDistHist;
  if (pVVar16 != (Vec_Int_t *)0x0) {
    if (pVVar16->pArray != (int *)0x0) {
      free(pVVar16->pArray);
    }
    free(pVVar16);
    pMVar12 = pManMR;
  }
  if (pMVar12->maxDelay != 0) {
    Abc_FlowRetime_FreeTiming(pNtk_00);
    pMVar12 = pManMR;
  }
  pVVar13 = pMVar12->vInitConstraints;
  iVar10 = pVVar13->nSize;
  while( true ) {
    if (iVar10 == 0) {
      free(pVVar13);
      pMVar12 = pManMR;
      pManMR->vInitConstraints = (Vec_Ptr_t *)0x0;
      if (pNtk_00->ntkType == ABC_NTK_STRASH) {
        Abc_NtkReassignIds(pNtk_00);
        pNtk_00 = Abc_FlowRetime_NtkSilentRestrash(pNtk_00,1);
        pMVar12 = pManMR;
      }
      if ((pMVar12->fVerbose != 0) &&
         (printf("\tfinal reg count = %d\n",(ulong)(uint)pNtk_00->nObjCounts[8]),
         pManMR->fVerbose != 0)) {
        uVar8 = Abc_NtkLevel(pNtk_00);
        printf("\tfinal levels = %d\n",(ulong)uVar8);
      }
      Abc_NtkDoCheck(pNtk_00);
      if (pManMR != (MinRegMan_t *)0x0) {
        free(pManMR);
        pManMR = (MinRegMan_t *)0x0;
      }
      return pNtk_00;
    }
    if (iVar10 < 1) break;
    pVVar13->nSize = iVar10 - 1U;
    pvVar6 = pVVar13->pArray[iVar10 - 1U];
    __ptr = *(void **)((long)pvVar6 + 0x10);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    free(pvVar6);
    pVVar13 = pManMR->vInitConstraints;
    iVar10 = pVVar13->nSize;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
LAB_0047a4a1:
  puts("WARNING: no equivalent init state. setting all initial states to don\'t-cares");
  pVVar13 = pNtk_00->vBoxes;
  if (0 < pVVar13->nSize) {
    lVar22 = 0;
    do {
      if ((*(uint *)((long)pVVar13->pArray[lVar22] + 0x14) & 0xf) == 8) {
        *(undefined8 *)((long)pVVar13->pArray[lVar22] + 0x38) = 3;
        pVVar13 = pNtk_00->vBoxes;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar13->nSize);
  }
  goto LAB_00479e60;
}

Assistant:

Abc_Ntk_t *
Abc_FlowRetime_MinReg( Abc_Ntk_t * pNtk, int fVerbose, 
                       int fComputeInitState, int fGuaranteeInitState, int fBlockConst,
                       int fForwardOnly, int fBackwardOnly, int nMaxIters,
                       int maxDelay, int fFastButConservative ) {

  int i;
  Abc_Obj_t   *pObj, *pNext;
  InitConstraint_t *pData;

  // create manager
  pManMR = ABC_ALLOC( MinRegMan_t, 1 );

  pManMR->pNtk = pNtk;
  pManMR->fVerbose = fVerbose;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fGuaranteeInitState = fGuaranteeInitState;
  pManMR->fBlockConst = fBlockConst;
  pManMR->fForwardOnly = fForwardOnly;
  pManMR->fBackwardOnly = fBackwardOnly;
  pManMR->nMaxIters = nMaxIters;
  pManMR->maxDelay = maxDelay;
  pManMR->fComputeInitState = fComputeInitState;
  pManMR->fConservTimingOnly = fFastButConservative;
  pManMR->vNodes = Vec_PtrAlloc(100);
  pManMR->vInitConstraints = Vec_PtrAlloc(2);
  pManMR->pInitNtk = NULL;
  pManMR->pInitToOrig = NULL;
  pManMR->sizeInitToOrig = 0;

  vprintf("Flow-based minimum-register retiming...\n");  

  if (!Abc_NtkHasOnlyLatchBoxes(pNtk)) {
    printf("\tERROR: Can not retime with black/white boxes\n");
    return pNtk;
  }

  if (maxDelay) {
    vprintf("\tmax delay constraint = %d\n", maxDelay);
    if (maxDelay < (i = Abc_NtkLevel(pNtk))) {
      printf("ERROR: max delay constraint (%d) must be > current max delay (%d)\n", maxDelay, i);
      return pNtk;
    }
  }

  // print info about type of network
  vprintf("\tnetlist type = ");
  if (Abc_NtkIsNetlist( pNtk )) { vprintf("netlist/"); }
  else if (Abc_NtkIsLogic( pNtk )) { vprintf("logic/"); }
  else if (Abc_NtkIsStrash( pNtk )) { vprintf("strash/"); }
  else { vprintf("***unknown***/"); }
  if (Abc_NtkHasSop( pNtk )) { vprintf("sop\n"); }
  else if (Abc_NtkHasBdd( pNtk )) { vprintf("bdd\n"); }
  else if (Abc_NtkHasAig( pNtk )) { vprintf("aig\n"); }
  else if (Abc_NtkHasMapping( pNtk )) { vprintf("mapped\n"); }
  else { vprintf("***unknown***\n"); }

  vprintf("\tinitial reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tinitial levels = %d\n", Abc_NtkLevel(pNtk));

  // remove bubbles from latch boxes
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);
  vprintf("\tpushing bubbles out of latch boxes\n");
  Abc_NtkForEachLatch( pNtk, pObj, i )
    Abc_FlowRetime_RemoveLatchBubbles(pObj);
  if (pManMR->fVerbose) Abc_FlowRetime_PrintInitStateInfo(pNtk);

  // check for box inputs/outputs
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    assert(Abc_ObjFaninNum(pObj) == 1);
    assert(Abc_ObjFanoutNum(pObj) == 1);
    assert(!Abc_ObjFaninC0(pObj));

    pNext = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBi(pNext));
    assert(Abc_ObjFaninNum(pNext) <= 1);
    if(Abc_ObjFaninNum(pNext) == 0) // every Bi should have a fanin
      Abc_FlowRetime_AddDummyFanin( pNext );
 
    pNext = Abc_ObjFanout0(pObj);
    assert(Abc_ObjIsBo(pNext));
    assert(Abc_ObjFaninNum(pNext) == 1);
    assert(!Abc_ObjFaninC0(pNext));
  }

  pManMR->nLatches = Abc_NtkLatchNum( pNtk );
  pManMR->nNodes = Abc_NtkObjNumMax( pNtk )+1;
   
  // build histogram
  pManMR->vSinkDistHist = Vec_IntStart( pManMR->nNodes*2+10 );

  // initialize timing
  if (maxDelay)
    Abc_FlowRetime_InitTiming( pNtk );

  // create lag and Flow_Data structure
  pManMR->vLags = Vec_IntStart(pManMR->nNodes);
  memset(pManMR->vLags->pArray, 0, sizeof(int)*pManMR->nNodes);

  pManMR->pDataArray = ABC_ALLOC( Flow_Data_t, pManMR->nNodes );
  Abc_FlowRetime_ClearFlows( 1 );

  // main loop!
  pNtk = Abc_FlowRetime_MainLoop();

  // cleanup node fields
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    // if not computing init state, set all latches to DC
    if (!fComputeInitState && Abc_ObjIsLatch(pObj))
      Abc_LatchSetInitDc(pObj);
  }

  // deallocate space
  ABC_FREE( pManMR->pDataArray );
  if (pManMR->pInitToOrig) ABC_FREE( pManMR->pInitToOrig );
  if (pManMR->vNodes) Vec_PtrFree(pManMR->vNodes);
  if (pManMR->vLags) Vec_IntFree(pManMR->vLags);
  if (pManMR->vSinkDistHist) Vec_IntFree(pManMR->vSinkDistHist);
  if (pManMR->maxDelay) Abc_FlowRetime_FreeTiming( pNtk );
  while( Vec_PtrSize( pManMR->vInitConstraints )) {
    pData = (InitConstraint_t*)Vec_PtrPop( pManMR->vInitConstraints );
    //assert( pData->pBiasNode );
    //Abc_NtkDeleteObj( pData->pBiasNode );
    ABC_FREE( pData->vNodes.pArray );
    ABC_FREE( pData );
  }
  ABC_FREE( pManMR->vInitConstraints );

  // restrash if necessary
  if (Abc_NtkIsStrash(pNtk)) {
    Abc_NtkReassignIds( pNtk );
    pNtk = Abc_FlowRetime_NtkSilentRestrash( pNtk, 1 );
  }
  
  vprintf("\tfinal reg count = %d\n", Abc_NtkLatchNum(pNtk));
  vprintf("\tfinal levels = %d\n", Abc_NtkLevel(pNtk));

#if defined(DEBUG_CHECK)
  Abc_NtkDoCheck( pNtk );
#endif

  // free manager
  ABC_FREE( pManMR );

  return pNtk;
}